

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  void *pvVar2;
  int argc_00;
  long lVar3;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  pos;
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  m;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  b;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  f;
  ArgumentParser p;
  CompletionFlag c;
  undefined1 local_c57;
  undefined1 local_c56;
  undefined1 local_c55;
  int local_c54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  undefined4 local_c30;
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  undefined4 local_c08;
  undefined1 local_c00 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be8;
  undefined2 local_bd8;
  undefined1 *local_bd0 [2];
  undefined1 local_bc0 [20];
  int local_bac;
  undefined1 local_ba8 [56];
  string local_b70;
  string local_b50;
  undefined1 local_b30 [16];
  undefined1 local_b20 [32];
  _Alloc_hider local_b00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_af8 [3];
  undefined1 local_a48 [16];
  __node_base local_a38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a30;
  undefined2 local_a20;
  _Alloc_hider local_a18;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a10 [3];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_938;
  undefined1 local_8f0 [8];
  _Alloc_hider local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_8b8 [5];
  undefined1 local_798 [344];
  ArgumentParser local_640;
  CompletionFlag local_180;
  
  local_798._0_8_ = local_798 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"parser","");
  local_8e8._M_p = (pointer)0x0;
  local_8e0[0]._M_local_buf[0] = '\0';
  local_8f0 = (undefined1  [8])local_8e0;
  args::ArgumentParser::ArgumentParser(&local_640,(string *)local_798,(string *)local_8f0);
  if (local_8f0 != (undefined1  [8])local_8e0) {
    operator_delete((void *)local_8f0);
  }
  if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
    operator_delete((void *)local_798._0_8_);
  }
  local_8f0 = (undefined1  [8])((ulong)local_8f0 & 0xffffffffffff0000);
  local_8e8._M_p = local_8e0[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"complete","");
  in._M_len = 1;
  in._M_array = (iterator)local_8f0;
  args::Matcher::Matcher((Matcher *)local_798,in);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>
            (&local_180,&local_640,(Matcher *)local_798);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_798 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_798);
  if (local_8e8._M_p != local_8e0[0]._M_local_buf + 8) {
    operator_delete(local_8e8._M_p);
  }
  local_b30._0_8_ = local_b20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b30,"name","");
  pcVar1 = local_c00 + 0x10;
  local_c00._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"description","");
  local_a48._8_8_ = &local_a30;
  local_a48._0_2_ = 0x6601;
  local_a38._M_nxt = (_Hash_node_base *)0x0;
  local_a30._M_local_buf[0] = '\0';
  local_a20 = 0;
  local_a18._M_p = (pointer)&local_a10[0]._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"foo","");
  in_00._M_len = 2;
  in_00._M_array = (iterator)local_a48;
  args::Matcher::Matcher((Matcher *)local_8f0,in_00);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"abc","");
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_798,(Group *)&local_640,(string *)local_b30,(string *)local_c00,
              (Matcher *)local_8f0,&local_c50,None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_8b8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_8f0);
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)local_a10 + lVar3 + -8);
    if ((void *)((long)&local_a10[0]._M_bucket_count + lVar3) != pvVar2) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  if ((pointer)local_c00._0_8_ != pcVar1) {
    operator_delete((void *)local_c00._0_8_);
  }
  if ((undefined1 *)local_b30._0_8_ != local_b20) {
    operator_delete((void *)local_b30._0_8_);
  }
  local_c00._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"name","");
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"description","");
  local_b30._8_8_ = local_b20 + 8;
  local_b30._0_2_ = 0x6201;
  local_b20._0_8_ = 0;
  local_b20[8] = '\0';
  local_b20._24_2_ = 0;
  local_b00._M_p = (pointer)&local_af8[0]._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"bar","");
  in_01._M_len = 2;
  in_01._M_array = (iterator)local_b30;
  args::Matcher::Matcher((Matcher *)local_a48,in_01);
  local_ba8._0_8_ = local_ba8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"abc","");
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_8f0,(Group *)&local_640,(string *)local_c00,&local_c50,(Matcher *)local_a48,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ba8,None);
  if ((undefined1 *)local_ba8._0_8_ != local_ba8 + 0x10) {
    operator_delete((void *)local_ba8._0_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_a10);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a48);
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)local_af8 + lVar3 + -8);
    if ((void *)((long)&local_af8[0]._M_bucket_count + lVar3) != pvVar2) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  if ((pointer)local_c00._0_8_ != pcVar1) {
    operator_delete((void *)local_c00._0_8_);
  }
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"mappos","");
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"mappos","");
  local_c00._8_8_ = &local_be8;
  local_c00._0_2_ = 0x6d01;
  local_c00._16_8_ = 0;
  local_be8._M_local_buf[0] = '\0';
  local_bd8 = 0;
  local_bd0[0] = local_bc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bd0,"map","");
  in_02._M_len = 2;
  in_02._M_array = (iterator)local_c00;
  args::Matcher::Matcher((Matcher *)local_b30,in_02);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  local_c54 = argc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"1","");
  local_c30 = 1;
  local_c28[0] = local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"2","");
  local_c08 = 2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,int>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_ba8,&local_c50,local_c00,0,&local_c55,&local_c56,&local_c57);
  local_bac = 0;
  args::
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
  ::MapFlag((MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_args::ValueReader,_args::detail::unordered_map>
             *)local_a48,(Group *)&local_640,&local_b50,&local_b70,(Matcher *)local_b30,
            (unordered_map<std::__cxx11::basic_string<char>,_int> *)local_ba8,&local_bac,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_ba8);
  argc_00 = local_c54;
  lVar3 = 0;
  do {
    if (local_c18 + lVar3 != *(undefined1 **)((long)local_c28 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_c28 + lVar3));
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_af8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b30);
  lVar3 = 0;
  do {
    if (local_bc0 + lVar3 != *(undefined1 **)((long)local_bd0 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_bd0 + lVar3));
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
    operator_delete(local_b70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p);
  }
  local_c00._0_8_ = local_c00 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c00,"name","");
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"desc","");
  local_ba8._8_8_ = 0;
  local_ba8[0x10] = '\0';
  local_ba8._0_8_ = local_ba8 + 0x10;
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_b30,(Group *)&local_640,(string *)local_c00,&local_c50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ba8,None);
  if ((undefined1 *)local_ba8._0_8_ != local_ba8 + 0x10) {
    operator_delete((void *)local_ba8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  if ((undefined1 *)local_c00._0_8_ != local_c00 + 0x10) {
    operator_delete((void *)local_c00._0_8_);
  }
  args::ArgumentParser::ParseCLI(&local_640,argc_00,argv);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                 *)local_b30);
  local_a48._0_8_ = &PTR__MapFlag_0011eb10;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_938);
  args::FlagBase::~FlagBase((FlagBase *)local_a48);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_8f0);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_798);
  args::CompletionFlag::~CompletionFlag(&local_180);
  local_640.super_Command.super_Group.super_Base._vptr_Base =
       (_func_int **)&PTR__ArgumentParser_0011e248;
  args::HelpParams::~HelpParams(&local_640.helpParams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640.terminator._M_dataplus._M_p != &local_640.terminator.field_2) {
    operator_delete(local_640.terminator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640.longseparator._M_dataplus._M_p != &local_640.longseparator.field_2) {
    operator_delete(local_640.longseparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640.shortprefix._M_dataplus._M_p != &local_640.shortprefix.field_2) {
    operator_delete(local_640.shortprefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640.longprefix._M_dataplus._M_p != &local_640.longprefix.field_2) {
    operator_delete(local_640.longprefix._M_dataplus._M_p);
  }
  args::Command::~Command(&local_640.super_Command);
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    args::ArgumentParser p("parser");
    args::CompletionFlag c(p, {"complete"});
    args::ValueFlag<std::string> f(p, "name", "description", {'f', "foo"}, "abc");
    args::ValueFlag<std::string> b(p, "name", "description", {'b', "bar"}, "abc");
    args::MapFlag<std::string, int> m(p, "mappos", "mappos", {'m', "map"}, {{"1",1}, {"2", 2}});
    args::Positional<std::string> pos(p, "name", "desc");

    try
    {
        p.ParseCLI(argc, argv);
    }
    catch (args::Completion &e)
    {
        std::cout << e.what();
    }

    return 0;
}